

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_addrinfo *pCVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  int iVar8;
  _Bool *p_Var9;
  _Bool _Var10;
  CURLcode CVar11;
  uint uVar12;
  CURLcode CVar13;
  timediff_t tVar14;
  int *piVar15;
  char *pcVar16;
  Curl_easy *pCVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  curltime cVar22;
  curltime newer;
  curltime older;
  curltime older_00;
  int error;
  char ipaddress [46];
  char buffer [256];
  int local_1a8;
  CURLcode local_1a4;
  int local_1a0;
  CURLcode local_19c;
  _Bool *local_198;
  curltime local_190;
  Curl_easy *local_180;
  ulong local_178;
  long local_170;
  char local_168 [48];
  char local_138 [264];
  
  pCVar17 = conn->data;
  local_1a8 = 0;
  *connected = false;
  local_170 = (long)sockindex;
  if ((conn->bits).tcpconnect[local_170] == true) {
    *connected = true;
  }
  else {
    local_198 = connected;
    cVar22 = Curl_now();
    local_190.tv_sec = cVar22.tv_sec;
    local_190.tv_usec = cVar22.tv_usec;
    local_178 = Curl_timeleft(pCVar17,&local_190,true);
    p_Var9 = local_198;
    if ((long)local_178 < 0) {
      Curl_failf(pCVar17,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    if ((conn->cnnct).state - CONNECT_SOCKS_INIT < 0x10) {
      CVar11 = connect_SOCKS(conn,sockindex,local_198);
      if (CVar11 != CURLE_OK) {
        return CVar11;
      }
      if (*p_Var9 != true) {
        return CURLE_OK;
      }
      post_SOCKS(conn,sockindex,p_Var9);
      return CURLE_OK;
    }
    lVar18 = -1;
    local_1a4 = CURLE_OK;
    local_1a0 = sockindex;
    local_180 = pCVar17;
    do {
      if (conn->tempsock[lVar18 + 1] == -1) {
        iVar20 = 6;
        CVar11 = local_19c;
      }
      else {
        uVar19 = (int)lVar18 + 1U ^ 1;
        uVar12 = Curl_socket_check(-1,-1,conn->tempsock[lVar18 + 1],0);
        if (uVar12 == 2) {
LAB_001283a9:
          _Var10 = verifyconnect(conn->tempsock[lVar18 + 1],&local_1a8);
          if (_Var10) {
            conn->sock[local_170] = conn->tempsock[lVar18 + 1];
            pCVar1 = conn->tempaddr[lVar18 + 1];
            conn->ip_addr = pCVar1;
            conn->tempsock[lVar18 + 1] = -1;
            *(uint *)&(conn->bits).field_0x4 =
                 *(uint *)&(conn->bits).field_0x4 & 0xfffff7ff |
                 (uint)(pCVar1->ai_family == 10) << 0xb;
            if (conn->tempsock[uVar19] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar19]);
              conn->tempsock[uVar19] = -1;
            }
            p_Var9 = local_198;
            local_1a4 = connect_SOCKS(conn,local_1a0,local_198);
            iVar20 = 1;
            CVar11 = local_1a4;
            if ((local_1a4 == CURLE_OK) && (CVar11 = local_1a4, *p_Var9 == true)) {
              post_SOCKS(conn,local_1a0,p_Var9);
              local_1a4 = CURLE_OK;
              local_19c = CURLE_OK;
              CVar11 = local_19c;
            }
            goto LAB_00128569;
          }
          Curl_infof(pCVar17,"Connection failed\n");
        }
        else if (uVar12 == 0) {
          local_1a8 = 0;
          cVar22.tv_usec = local_190.tv_usec;
          cVar22.tv_sec = local_190.tv_sec;
          uVar4 = (conn->connecttime).tv_sec;
          uVar5 = (conn->connecttime).tv_usec;
          older.tv_usec = uVar5;
          older.tv_sec = uVar4;
          cVar22._12_4_ = 0;
          older._12_4_ = 0;
          tVar14 = Curl_timediff(cVar22,older);
          if (conn->timeoutms_per_addr <= tVar14) {
            Curl_infof(pCVar17,"After %ldms connect time, move on!\n");
            local_1a8 = 0x6e;
          }
          if (((lVar18 == -1) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
             (newer.tv_usec = local_190.tv_usec, newer.tv_sec = local_190.tv_sec,
             uVar6 = (conn->connecttime).tv_sec, uVar7 = (conn->connecttime).tv_usec,
             older_00.tv_usec = uVar7, older_00.tv_sec = uVar6, newer._12_4_ = 0,
             older_00._12_4_ = 0, tVar14 = Curl_timediff(newer,older_00),
             (pCVar17->set).happy_eyeballs_timeout <= tVar14)) {
            trynextip(conn,local_1a0,1);
          }
        }
        else {
          if (((conn->bits).field_0x7 & 8) != 0) goto LAB_001283a9;
          if ((uVar12 & 4) != 0) {
            verifyconnect(conn->tempsock[lVar18 + 1],&local_1a8);
          }
        }
        iVar8 = local_1a8;
        iVar21 = 0;
        iVar20 = 0;
        CVar11 = local_19c;
        if (local_1a8 != 0) {
          (pCVar17->state).os_errno = local_1a8;
          piVar15 = __errno_location();
          *piVar15 = iVar8;
          iVar20 = iVar21;
          CVar11 = local_19c;
          if (conn->tempaddr[lVar18 + 1] != (Curl_addrinfo *)0x0) {
            Curl_printable_address(conn->tempaddr[lVar18 + 1],local_168,0x2e);
            lVar2 = conn->port;
            pcVar16 = Curl_strerror(local_1a8,local_138,0x100);
            Curl_infof(pCVar17,"connect to %s port %ld failed: %s\n",local_168,lVar2,pcVar16);
            conn->timeoutms_per_addr =
                 local_178 >> (conn->tempaddr[lVar18 + 1]->ai_next != (Curl_addrinfo *)0x0);
            CVar13 = trynextip(conn,local_1a0,(int)lVar18 + 1);
            pCVar17 = local_180;
            CVar11 = local_19c;
            if ((CVar13 != CURLE_COULDNT_CONNECT) || (conn->tempsock[uVar19] == -1)) {
              local_1a4 = CVar13;
            }
          }
        }
      }
LAB_00128569:
      local_19c = CVar11;
      if ((iVar20 != 6) && (iVar20 != 0)) {
        return local_19c;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 == 0);
    if (local_1a4 != CURLE_OK) {
      CVar11 = local_1a4;
      if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
         (CVar11 = trynextip(conn,local_1a0,1), CVar11 == CURLE_OK)) {
        return CURLE_OK;
      }
      uVar12 = *(uint *)&(conn->bits).field_0x4;
      lVar18 = 0x390;
      if ((-1 < (char)uVar12) &&
         ((lVar18 = 0x3d0, (uVar12 & 0x40) == 0 && (lVar18 = 0x370, (uVar12 & 8) == 0)))) {
        lVar18 = 0x340;
      }
      uVar3 = *(undefined8 *)((conn->cnnct).socksreq + lVar18 + -0xc);
      lVar18 = conn->port;
      pcVar16 = Curl_strerror(local_1a8,local_138,0x100);
      Curl_failf(pCVar17,"Failed to connect to %s port %ld: %s",uVar3,lVar18,pcVar16);
      if ((pCVar17->state).os_errno != 0x6e) {
        return CVar11;
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  timediff_t allow;
  int error = 0;
  struct curltime now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_now();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(SOCKS_STATE(conn->cnnct.state)) {
    /* still doing SOCKS */
    result = connect_SOCKS(conn, sockindex, connected);
    if(!result && *connected)
      post_SOCKS(conn, sockindex, connected);
    return result;
  }

  for(i = 0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef ENABLE_QUIC
    if(conn->transport == TRNSPRT_QUIC) {
      result = Curl_quic_is_connected(conn, i, connected);
      if(result) {
        error = SOCKERRNO;
        goto error;
      }
      if(*connected) {
        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
        connkeep(conn, "HTTP/3 default");
      }
      return result;
    }
#endif

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(Curl_timediff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %" CURL_FORMAT_TIMEDIFF_T
              "ms connect time, move on!\n", conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         (Curl_timediff(now, conn->connecttime) >=
          data->set.happy_eyeballs_timeout)) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;
#ifdef ENABLE_IPV6
        conn->bits.ipv6 = (conn->ip_addr->ai_family == AF_INET6)?TRUE:FALSE;
#endif

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to kick off any SOCKS proxy magic once we
           connected */
        result = connect_SOCKS(conn, sockindex, connected);
        if(result || !*connected)
          return result;

        post_SOCKS(conn, sockindex, connected);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

#ifdef ENABLE_QUIC
    error:
#endif
    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
#ifndef CURL_DISABLE_VERBOSE_STRINGS
        char ipaddress[MAX_IPADR_LEN];
        char buffer[STRERROR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
#endif
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
          allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if((status != CURLE_COULDNT_CONNECT) ||
           conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */
    const char *hostname;
    char buffer[STRERROR_LEN];

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
          hostname, conn->port,
          Curl_strerror(error, buffer, sizeof(buffer)));

#ifdef WSAETIMEDOUT
    if(WSAETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#elif defined(ETIMEDOUT)
    if(ETIMEDOUT == data->state.os_errno)
      result = CURLE_OPERATION_TIMEDOUT;
#endif
  }

  return result;
}